

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>
::fastAccessDx(FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>
               *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int iVar10;
  int iVar11;
  Fad<double> *pFVar12;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_> *pFVar13
  ;
  FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_> *pFVar14;
  Fad<double> *pFVar15;
  Fad<double> *pFVar16;
  value_type vVar17;
  value_type vVar18;
  value_type vVar19;
  value_type vVar20;
  
  pFVar12 = (this->left_->fadexpr_).left_;
  pFVar13 = (this->left_->fadexpr_).right_;
  pFVar14 = (pFVar13->fadexpr_).left_;
  pFVar15 = (pFVar13->fadexpr_).right_;
  iVar10 = (pFVar14->fadexpr_).left_.constant_;
  pFVar16 = (pFVar14->fadexpr_).right_;
  dVar1 = pFVar16->val_;
  dVar2 = pFVar15->val_;
  dVar3 = (pFVar15->dx_).ptr_to_data[i];
  dVar4 = (pFVar16->dx_).ptr_to_data[i];
  dVar5 = pFVar12->val_;
  dVar6 = (pFVar12->dx_).ptr_to_data[i];
  vVar17 = FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>
           ::val(&this->right_->fadexpr_);
  vVar18 = FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>
           ::fastAccessDx(&this->right_->fadexpr_,i);
  pFVar13 = (this->left_->fadexpr_).right_;
  pFVar14 = (pFVar13->fadexpr_).left_;
  iVar11 = (pFVar14->fadexpr_).left_.constant_;
  dVar7 = ((pFVar14->fadexpr_).right_)->val_;
  dVar8 = ((pFVar13->fadexpr_).right_)->val_;
  dVar9 = ((this->left_->fadexpr_).left_)->val_;
  vVar19 = FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>
           ::val(&this->right_->fadexpr_);
  vVar20 = FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>
           ::val(&this->right_->fadexpr_);
  return (vVar17 * ((((double)iVar10 - dVar1) + dVar2) * dVar6 + (dVar3 - dVar4) * dVar5) -
         (((double)iVar11 - dVar7) + dVar8) * dVar9 * vVar18) / (vVar20 * vVar19);
}

Assistant:

value_type fastAccessDx(int i) const { return (left_.fastAccessDx(i) * right_.val() - right_.fastAccessDx(i) * left_.val() ) 
					   / (right_.val() * right_.val()) ;}